

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall spvtools::opt::Instruction::ClearDbgLineInsts(Instruction *this)

{
  pointer pIVar1;
  DefUseManager *this_00;
  Instruction *l_inst;
  pointer pIVar2;
  pointer pIVar3;
  
  if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    pIVar2 = (this->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (this->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar2 != pIVar1) {
      this_00 = (this->context_->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      do {
        analysis::DefUseManager::ClearInst(this_00,pIVar2);
        pIVar2 = pIVar2 + 1;
      } while (pIVar2 != pIVar1);
    }
  }
  pIVar2 = (this->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (this->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar3 = pIVar2;
  if (pIVar1 != pIVar2) {
    do {
      (**(pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase)
                (pIVar3);
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar1);
    (this->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  return;
}

Assistant:

void Instruction::ClearDbgLineInsts() {
  if (context()->AreAnalysesValid(IRContext::kAnalysisDefUse)) {
    auto def_use_mgr = context()->get_def_use_mgr();
    for (auto& l_inst : dbg_line_insts_) def_use_mgr->ClearInst(&l_inst);
  }
  clear_dbg_line_insts();
}